

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_tcp_bind(uv_tcp_t *handle,sockaddr *addr,uint flags)

{
  uint local_28;
  uint addrlen;
  uint flags_local;
  sockaddr *addr_local;
  uv_tcp_t *handle_local;
  
  if (handle->type == UV_TCP) {
    if (addr->sa_family == 2) {
      local_28 = 0x10;
    }
    else {
      if (addr->sa_family != 10) {
        return -0x16;
      }
      local_28 = 0x1c;
    }
    handle_local._4_4_ = uv__tcp_bind(handle,addr,local_28,flags);
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_bind(uv_tcp_t* handle,
                const struct sockaddr* addr,
                unsigned int flags) {
  unsigned int addrlen;

  if (handle->type != UV_TCP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__tcp_bind(handle, addr, addrlen, flags);
}